

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Privkey::SignMessage
          (ByteData *__return_storage_ptr__,Privkey *this,string *message,string *message_magic)

{
  ByteData256 hash;
  
  HashMessage(&hash,message,message_magic);
  SignatureUtil::CalculateEcSignature(__return_storage_ptr__,&hash,this,false,true);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
  return __return_storage_ptr__;
}

Assistant:

ByteData Privkey::SignMessage(
    const std::string &message, const std::string &message_magic) const {
  ByteData256 hash = HashMessage(message, message_magic);
  return SignatureUtil::CalculateEcSignature(hash, *this, false, true);
}